

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

void tcptran_ep_init(tcptran_ep *ep,nni_sock *sock,_func_void_void_ptr *conn_cb)

{
  uint16_t uVar1;
  
  nni_mtx_init(&ep->mtx);
  nni_list_init_offset(&ep->waitpipes,0x28);
  nni_list_init_offset(&ep->negopipes,0x28);
  uVar1 = nni_sock_proto_id(sock);
  ep->proto = uVar1;
  nni_aio_init(&ep->connaio,conn_cb,ep);
  nni_aio_init(&ep->timeaio,tcptran_timer_cb,ep);
  nni_stat_init(&ep->st_rcv_max,&tcptran_ep_init::rcv_max_info);
  return;
}

Assistant:

static void
tcptran_ep_init(tcptran_ep *ep, nni_sock *sock, void (*conn_cb)(void *))
{
	nni_mtx_init(&ep->mtx);
	NNI_LIST_INIT(&ep->waitpipes, tcptran_pipe, node);
	NNI_LIST_INIT(&ep->negopipes, tcptran_pipe, node);

	ep->proto = nni_sock_proto_id(sock);
	nni_aio_init(&ep->connaio, conn_cb, ep);
	nni_aio_init(&ep->timeaio, tcptran_timer_cb, ep);

#ifdef NNG_ENABLE_STATS
	static const nni_stat_info rcv_max_info = {
		.si_name   = "rcv_max",
		.si_desc   = "maximum receive size",
		.si_type   = NNG_STAT_LEVEL,
		.si_unit   = NNG_UNIT_BYTES,
		.si_atomic = true,
	};
	nni_stat_init(&ep->st_rcv_max, &rcv_max_info);
#endif
}